

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_cast_char_test.cpp
# Opt level: O0

void __thiscall
reflect_value_cast_char_test_char_to_long_cast_Test::TestBody
          (reflect_value_cast_char_test_char_to_long_cast_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  char c;
  value v;
  long *in_stack_ffffffffffffff90;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  AssertHelper in_stack_ffffffffffffffa8;
  Message local_50 [3];
  undefined8 local_38;
  long local_30;
  AssertionResult local_28;
  char local_11;
  undefined8 local_10;
  
  local_10 = value_create_char(0x43);
  local_11 = value_to_char(local_10);
  local_10 = value_type_cast(local_10,4);
  local_30 = (long)local_11;
  local_38 = value_to_long(local_10);
  this_00 = &local_28;
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((char *)in_stack_ffffffffffffffa8.data_,
             (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),(long *)this_00,
             in_stack_ffffffffffffff90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(local_50);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x1197a3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_value_cast_test/source/reflect_value_cast_char_test.cpp"
               ,0x5b,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffffa8,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa8);
    testing::Message::~Message((Message *)0x1197f1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x119831);
  value_destroy(local_10);
  return;
}

Assistant:

TEST_F(reflect_value_cast_char_test, char_to_long_cast)
{
	value v = value_create_char('C');

	char c = value_to_char(v);

	v = value_type_cast(v, TYPE_LONG);

	EXPECT_EQ((long)c, (long)value_to_long(v));

	value_destroy(v);
}